

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O0

void __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchically_TestShell::
~TEST_MockHierarchyTest_EnableDisableWorkHierarchically_TestShell
          (TEST_MockHierarchyTest_EnableDisableWorkHierarchically_TestShell *this)

{
  TEST_MockHierarchyTest_EnableDisableWorkHierarchically_TestShell *this_local;
  
  ~TEST_MockHierarchyTest_EnableDisableWorkHierarchically_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchically)
{
    mock("first");

    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(1, mock("first").expectedCallsLeft());

    mock("first").clear();
}